

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

void nn_hash_insert(nn_hash *self,uint32_t key,nn_hash_item *item)

{
  uint32_t uVar1;
  nn_list *pnVar2;
  ulong uVar3;
  nn_list_item *pnVar4;
  nn_list_item *pnVar5;
  uint uVar6;
  
  uVar6 = (key >> 0x10 ^ key ^ 0x3d) * 9;
  uVar6 = (uVar6 >> 4 ^ uVar6) * 0x27d4eb2d;
  uVar3 = (ulong)(uVar6 >> 0xf ^ uVar6) % (ulong)self->slots;
  pnVar4 = nn_list_begin(self->array + uVar3);
  do {
    pnVar5 = nn_list_end(self->array + uVar3);
    if (pnVar4 == pnVar5) {
      item->key = key;
      pnVar2 = self->array;
      pnVar4 = nn_list_end(pnVar2 + uVar3);
      nn_list_insert(pnVar2 + uVar3,&item->list,pnVar4);
      uVar1 = self->items;
      self->items = uVar1 + 1;
      if ((int)self->slots < 0 || uVar1 * 2 + 2 <= self->slots) {
        return;
      }
LAB_001a46ee:
      nn_hash_rehash(self);
      return;
    }
    if (*(uint32_t *)&pnVar4[-1].prev == key) {
      nn_hash_insert_cold_1();
      goto LAB_001a46ee;
    }
    pnVar4 = nn_list_next(self->array + uVar3,pnVar4);
  } while( true );
}

Assistant:

void nn_hash_insert (struct nn_hash *self, uint32_t key,
    struct nn_hash_item *item)
{
    struct nn_list_item *it;
    uint32_t i;

    i = nn_hash_key (key) % self->slots;

    for (it = nn_list_begin (&self->array [i]);
          it != nn_list_end (&self->array [i]);
          it = nn_list_next (&self->array [i], it))
        nn_assert (nn_cont (it, struct nn_hash_item, list)->key != key);

    item->key = key;
    nn_list_insert (&self->array [i], &item->list,
        nn_list_end (&self->array [i]));
    ++self->items;

    /*  If the hash is getting full, double the amount of slots and
        re-hash all the items. */
    if (nn_slow (self->items * 2 > self->slots && self->slots < 0x80000000))
    nn_hash_rehash(self);
}